

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

bool __thiscall Json::Value::isUInt64(Value *this)

{
  double d;
  bool bVar1;
  unsigned_long_long val;
  unsigned_long_long local_40;
  string local_38;
  
  bVar1 = true;
  switch(this->field_0x8) {
  case 1:
  case 3:
    bVar1 = -1 < (this->value_).int_;
    break;
  case 2:
    break;
  case 4:
    d = (this->value_).real_;
    bVar1 = false;
    if ((0.0 <= d) && (d < 1.8446744073709552e+19)) {
      bVar1 = IsIntegral(d);
      return bVar1;
    }
    break;
  case 5:
    asString_abi_cxx11_(&local_38,this);
    bVar1 = converToUInt64(local_38._M_dataplus._M_p,&local_40);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      return true;
    }
  default:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Value::isUInt64() const {
#if defined(JSON_HAS_INT64)
  switch (type_) {
  case int64Value:
  case intValue:
    return value_.int_ >= 0;
  case uintValue:
    return true;
  case realValue:
    // Note that maxUInt64 (= 2^64 - 1) is not exactly representable as a
    // double, so double(maxUInt64) will be rounded up to 2^64. Therefore we
    // require the value to be strictly less than the limit.
    return value_.real_ >= 0 && value_.real_ < maxUInt64AsDouble &&
           IsIntegral(value_.real_);
  case stringValue:
    unsigned long long int val;

    if (!converToUInt64 (asString().c_str(), &val)) {
      break;
    }

    return IsInRange (val, 0, maxUInt64);
  default:
    break;
  }
#endif // JSON_HAS_INT64
  return false;
}